

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ViewRelation::GetTableRef(ViewRelation *this)

{
  pointer pTVar1;
  BaseTableRef *this_00;
  pointer pBVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_20;
  
  if (*(long *)(in_RSI + 0xc0) == 0) {
    this_00 = (BaseTableRef *)operator_new(0xd0);
    BaseTableRef::BaseTableRef(this_00);
    local_20._M_head_impl = this_00;
    pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_20);
    ::std::__cxx11::string::_M_assign((string *)&pBVar2->schema_name);
    pBVar2 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_20);
    ::std::__cxx11::string::_M_assign((string *)&pBVar2->table_name);
    (this->super_Relation)._vptr_Relation = (_func_int **)local_20._M_head_impl;
  }
  else {
    pTVar1 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *
                        )(in_RSI + 0xc0));
    (*pTVar1->_vptr_TableRef[4])(this,pTVar1);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ViewRelation::GetTableRef() {
	if (premade_tableref) {
		return premade_tableref->Copy();
	}
	auto table_ref = make_uniq<BaseTableRef>();
	table_ref->schema_name = schema_name;
	table_ref->table_name = view_name;
	return std::move(table_ref);
}